

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O2

void __thiscall
capnp::EzRpcServer::Impl::Impl
          (Impl *this,Client *mainInterface,sockaddr *bindAddress,uint addrSize,
          ReaderOptions readerOpts)

{
  _Rb_tree_header *p_Var1;
  ClientHook *pCVar2;
  int iVar3;
  FixVoid<unsigned_int> value;
  undefined4 extraout_var;
  ReaderOptions readerOpts_00;
  Own<kj::ConnectionReceiver> listener;
  Own<kj::_::ForkHub<unsigned_int>_> local_70;
  Own<kj::_::ForkHub<unsigned_int>_> *local_60;
  Own<kj::ConnectionReceiver> local_58;
  Own<capnp::EzRpcContext> *local_48;
  Own<kj::_::PromiseNode> local_40;
  
  (this->super_SturdyRefRestorer<capnp::AnyPointer>).super_SturdyRefRestorerBase.
  _vptr_SturdyRefRestorerBase = (_func_int **)&PTR_baseRestore_00672f60;
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)&DAT_00672f88;
  pCVar2 = (mainInterface->hook).ptr;
  (this->mainInterface).hook.disposer = (mainInterface->hook).disposer;
  (this->mainInterface).hook.ptr = pCVar2;
  (mainInterface->hook).ptr = (ClientHook *)0x0;
  local_48 = &this->context;
  EzRpcContext::getThreadLocal();
  p_Var1 = &(this->exportMap)._M_t._M_impl.super__Rb_tree_header;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_60 = &(this->portPromise).hub;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->portPromise).hub.disposer = (Disposer *)0x0;
  (this->portPromise).hub.ptr = (ForkHub<unsigned_int> *)0x0;
  kj::TaskSet::TaskSet(&this->tasks,&this->super_ErrorHandler);
  iVar3 = (*((((this->context).ptr)->ioContext).provider.ptr)->_vptr_AsyncIoProvider[3])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 8))
            (&local_70,(long *)CONCAT44(extraout_var,iVar3),bindAddress,addrSize);
  (*((local_70.ptr)->super_ForkHubBase).super_Refcounted.super_Disposer._vptr_Disposer[1])
            (&local_58);
  kj::Own<kj::NetworkAddress>::dispose((Own<kj::NetworkAddress> *)&local_70);
  value = (*(local_58.ptr)->_vptr_ConnectionReceiver[1])();
  kj::Promise<unsigned_int>::Promise((Promise<unsigned_int> *)&local_40,value);
  kj::Promise<unsigned_int>::fork((Promise<unsigned_int> *)&local_70);
  kj::Own<kj::_::ForkHub<unsigned_int>_>::operator=(local_60,&local_70);
  kj::Own<kj::_::ForkHub<unsigned_int>_>::dispose(&local_70);
  kj::Own<kj::_::PromiseNode>::dispose(&local_40);
  readerOpts_00._8_8_ = readerOpts._8_8_ & 0xffffffff;
  readerOpts_00.traversalLimitInWords = readerOpts.traversalLimitInWords;
  acceptLoop(this,&local_58,readerOpts_00);
  kj::Own<kj::ConnectionReceiver>::dispose(&local_58);
  return;
}

Assistant:

Impl(Capability::Client mainInterface, struct sockaddr* bindAddress, uint addrSize,
       ReaderOptions readerOpts)
      : mainInterface(kj::mv(mainInterface)),
        context(EzRpcContext::getThreadLocal()), portPromise(nullptr), tasks(*this) {
    auto listener = context->getIoProvider().getNetwork()
        .getSockaddr(bindAddress, addrSize)->listen();
    portPromise = kj::Promise<uint>(listener->getPort()).fork();
    acceptLoop(kj::mv(listener), readerOpts);
  }